

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,OccludingGeometryComplexityCostCase *this)

{
  int resolution;
  deUint32 dVar1;
  uint uVar2;
  char *str;
  CommandLine *this_00;
  vector<float,_std::allocator<float>_> local_100;
  ProgramSources local_e8;
  OccludingGeometryComplexityCostCase *local_18;
  OccludingGeometryComplexityCostCase *this_local;
  
  local_18 = this;
  this_local = (OccludingGeometryComplexityCostCase *)__return_storage_ptr__;
  Utils::getBaseShader();
  resolution = this->m_resolution;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  dVar1 = ::deInt32Hash(dVar1);
  this_00 = tcu::TestContext::getCommandLine
                      ((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                       m_testCtx);
  uVar2 = tcu::CommandLine::getBaseSeed(this_00);
  Utils::getFullScreenGrid(&local_100,resolution,dVar1 ^ uVar2,0.2,this->m_zNoise,this->m_xyNoise);
  ObjectData::ObjectData(__return_storage_ptr__,&local_e8,&local_100);
  std::vector<float,_std::allocator<float>_>::~vector(&local_100);
  glu::ProgramSources::~ProgramSources(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry						(void) const
	{
		return ObjectData(Utils::getBaseShader(),
						  Utils::getFullScreenGrid(m_resolution,
						  deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed(),
						  0.2f,
						  m_zNoise,
						  m_xyNoise));
	}